

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.hpp
# Opt level: O0

bool CoreML::Specification::operator==(RepeatedField<double> *a,RepeatedField<double> *b)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int local_24;
  int i;
  RepeatedField<double> *b_local;
  RepeatedField<double> *a_local;
  
  iVar2 = google::protobuf::RepeatedField<double>::size(a);
  iVar3 = google::protobuf::RepeatedField<double>::size(b);
  if (iVar2 == iVar3) {
    for (local_24 = 0; iVar2 = google::protobuf::RepeatedField<double>::size(a), local_24 < iVar2;
        local_24 = local_24 + 1) {
      pdVar4 = google::protobuf::RepeatedField<double>::operator[](a,local_24);
      dVar1 = *pdVar4;
      pdVar4 = google::protobuf::RepeatedField<double>::operator[](b,local_24);
      if ((dVar1 != *pdVar4) || (NAN(dVar1) || NAN(*pdVar4))) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const ::google::protobuf::RepeatedField<T>& a,
                        const ::google::protobuf::RepeatedField<T>& b) {
            if (a.size() != b.size()) {
                return false;
            }
            for (int i=0; i<a.size(); i++) {
                if (a[i] != b[i]) {
                    return false;
                }
            }
            return true;
        }